

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

void __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
::TypedExpectation(TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                   *this,FunctionMocker<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                         *owner,char *a_file,int a_line,string *a_source_text,
                  ArgumentMatcherTuple *m)

{
  MatcherInterface<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>
  *__p;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002e5a40;
  this->owner_ = owner;
  std::
  _Tuple_impl<0UL,_testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>,_testing::Matcher<unsigned_short>_>
  ::_Tuple_impl(&(this->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>,_testing::Matcher<unsigned_short>_>
                ,&m->
                  super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>,_testing::Matcher<unsigned_short>_>
               );
  __p = (MatcherInterface<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>
         *)operator_new(8);
  (__p->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002e5a88;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002e3ad8;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>
  .impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<std::tuple<ot::commissioner::ActiveOperationalDataset&,unsigned_short>const&>const*>
            (&(this->extra_matcher_).
              super_MatcherBase<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>
              .impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<ot::commissioner::ActiveOperationalDataset_&,_unsigned_short>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002e5af0;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}